

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::createUnreachable(Builder *this)

{
  Block *this_00;
  Instruction *this_01;
  size_t in_RSI;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_30 [3];
  Instruction *local_18;
  Instruction *merge;
  Builder *this_local;
  
  merge = (Instruction *)this;
  this_01 = (Instruction *)Instruction::operator_new((Instruction *)0x38,in_RSI);
  Instruction::Instruction(this_01,OpUnreachable);
  this_00 = this->buildPoint;
  local_18 = this_01;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_30,this_01)
  ;
  Block::addInstruction(this_00,local_30);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_30);
  return;
}

Assistant:

void Builder::createUnreachable()
{
    Instruction* merge = new Instruction(OpUnreachable);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(merge));
}